

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_align.c
# Opt level: O0

int32 id_cmp(char *str1,char *str2)

{
  char cVar1;
  char cVar2;
  char c2;
  char *pcStack_20;
  char c1;
  char *str2_local;
  char *str1_local;
  
  pcStack_20 = str2;
  str2_local = str1;
  while( true ) {
    cVar1 = *str2_local;
    if (('`' < cVar1) && (cVar1 < '{')) {
      cVar1 = cVar1 + -0x20;
    }
    cVar2 = *pcStack_20;
    if (('`' < cVar2) && (cVar2 < '{')) {
      cVar2 = cVar2 + -0x20;
    }
    if (cVar1 != cVar2) break;
    pcStack_20 = pcStack_20 + 1;
    str2_local = str2_local + 1;
    if (cVar1 == '\0') {
      return 0;
    }
  }
  return (int)cVar1 - (int)cVar2;
}

Assistant:

static int32
id_cmp(char *str1, char *str2)
{
    char c1, c2;

    for (;;) {
        c1 = *(str1++);
        c1 = UPPER_CASE(c1);
        c2 = *(str2++);
        c2 = UPPER_CASE(c2);
        if (c1 != c2)
            return (c1 - c2);
        if (c1 == '\0')
            return 0;
    }
}